

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  float *pfVar2;
  ostream *poVar3;
  long *plVar4;
  float *data;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  pointer pvVar8;
  double dVar9;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result1;
  BruteForceIndex bf_index;
  L2Distance distance;
  HNSWIndex hnsw_index;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_198;
  undefined1 local_178 [16];
  pointer local_168;
  float *local_158;
  BruteForceIndex local_150;
  Distance local_108;
  HNSWIndex local_f0;
  
  pfVar2 = (float *)operator_new__(3200000);
  GenerateRandomFloat(pfVar2,800000);
  local_108.num = 0;
  local_108.dim_ = 8;
  local_108._vptr_Distance = (_func_int **)&PTR_operator___0010acd8;
  hnsw::HNSWIndex::HNSWIndex(&local_f0,pfVar2,100000,8,&local_108,0x10,0x32);
  local_150.super_Index._vptr_Index = (_func_int **)&PTR_Build_0010ad80;
  local_158 = pfVar2;
  hnsw::Matrix::Matrix(&local_150.points_,pfVar2,100000,8);
  local_150.num_points_ = 100000;
  local_150.dim_ = 8;
  local_150.distance_ = &local_108;
  std::chrono::_V2::steady_clock::now();
  if (local_f0.points_.rows_ != 0) {
    uVar7 = 0;
    do {
      hnsw::HNSWIndex::Insert(&local_f0,(index_t)uVar7);
      uVar7 = (ulong)((index_t)uVar7 + 1);
    } while (uVar7 < local_f0.points_.rows_);
  }
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HNSW Build time: ",0x11)
  ;
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Top layer: ",0xb);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_f0.top_layer_);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance calculations: ",0x17);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  data = (float *)operator_new__(32000);
  GenerateRandomFloat(data,8000);
  local_f0.ef_search_ = 0x100;
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(24000);
  pvVar8 = local_198.
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1000;
  lVar6 = 0;
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar8;
  memset(local_198.
         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start,0,24000);
  local_198.
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar8;
  std::chrono::_V2::steady_clock::now();
  pfVar2 = data;
  do {
    hnsw::HNSWIndex::Search((PointSet *)local_1b8,&local_f0,100,pfVar2);
    pvVar5 = *(void **)((long)&((local_198.
                                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar6);
    puVar1 = (undefined8 *)
             ((long)&((local_198.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar6);
    *puVar1 = local_1b8._0_8_;
    puVar1[1] = local_1b8._8_8_;
    local_1b8 = ZEXT816(0) << 0x20;
    *(pointer *)
     ((long)&((local_198.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6) = local_1a8;
    local_1a8 = (pointer)0x0;
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    pfVar2 = pfVar2 + 8;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 24000);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HNSW: ",6);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_aa12,10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pvVar5 = operator_new(24000);
  local_1b8._0_8_ = pvVar5;
  lVar6 = 0;
  local_1a8 = (pointer)((long)pvVar5 + 24000);
  memset(pvVar5,0,24000);
  local_1b8._8_8_ = (pointer)((long)pvVar5 + 24000);
  std::chrono::_V2::steady_clock::now();
  pfVar2 = data;
  do {
    hnsw::BruteForceIndex::Search((PointSet *)local_178,&local_150,100,pfVar2);
    pvVar5 = *(void **)((long)(uint *)local_1b8._0_8_ + lVar6);
    puVar1 = (undefined8 *)((long)(uint *)local_1b8._0_8_ + lVar6);
    *puVar1 = local_178._0_8_;
    puVar1[1] = local_178._8_8_;
    local_178 = ZEXT816(0) << 0x20;
    *(pointer *)((long)&((pointer)(local_1b8._0_8_ + 0x10))->first + lVar6) = local_168;
    local_168 = (pointer)0x0;
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5);
      if ((pointer)local_178._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_178._0_8_);
      }
    }
    pfVar2 = pfVar2 + 8;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 24000);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BruteForce: ",0xc);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_aa12,10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Recall@100: ",0xc);
  dVar9 = ComputeRecall((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         *)local_1b8,&local_198);
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  operator_delete(local_158);
  operator_delete(data);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             *)local_1b8);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&local_198);
  local_150.super_Index._vptr_Index = (_func_int **)&PTR_Build_0010ad80;
  if (local_150.points_.row_ptrs_.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.points_.row_ptrs_.
                    super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  hnsw::HNSWIndex::~HNSWIndex(&local_f0);
  return 0;
}

Assistant:

int main(void) {
  const uint32_t dim = 8;
  const uint32_t n_points = 100000;
  const uint32_t n_queries = 1000;
  float *points = new float[dim * n_points];
  GenerateRandomFloat(points, dim * n_points);

  const uint32_t M = 16;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 50;
  const uint32_t K = 100;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(points, n_points, dim, distance, M, ef_construction);
  hnsw::BruteForceIndex bf_index(points, n_points, dim, distance);

  // Test build
  auto t0 = std::chrono::steady_clock::now();
  hnsw_index.Build();
  auto t1 = std::chrono::steady_clock::now();
  auto duration = duration_cast<milliseconds>(t1 - t0).count();
  cout << "HNSW Build time: " << duration << "ms" << endl;
  cout << "Top layer: " << hnsw_index.TopLayer() << endl;
  cout << "Distance calculations: " << distance.num << endl;

  float *queries = new float[dim * n_queries];
  GenerateRandomFloat(queries, dim * n_queries);

  hnsw_index.SetEfSearch(ef_search);

  std::vector<PointSet> result1(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result1[i] = hnsw_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "HNSW: " << duration / n_queries << " µs/query" << endl;

  std::vector<PointSet> result2(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result2[i] = bf_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "BruteForce: " << duration / n_queries << " µs/query" << endl;

  cout << "Recall@100: " << ComputeRecall(result2, result1) << endl;

  delete points;
  delete queries;

  return 0;
}